

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> * __thiscall
helics::apps::Connector::buildPossibleConnectionList
          (vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
           *__return_storage_ptr__,Connector *this,string_view startingInterface,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *tagList)

{
  unsigned_long *puVar1;
  pointer puVar2;
  size_t sVar3;
  pointer psVar4;
  RegexMatcher *this_00;
  element_type *peVar5;
  char *pcVar6;
  string_view testString;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  int iVar7;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
  _Var8;
  pointer pCVar9;
  iterator iVar10;
  pointer puVar11;
  unsigned_long *puVar12;
  type match_1;
  pointer psVar13;
  Connection *__p;
  unsigned_long *puVar14;
  pointer puVar15;
  pointer pCVar16;
  ulong uVar17;
  type match;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>_>
  pVar18;
  string mstring;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  searched;
  undefined1 local_e1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  string local_c8;
  key_type local_a8;
  undefined1 local_98 [16];
  _Base_ptr local_88;
  _Base_ptr p_Stack_80;
  _Base_ptr local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  element_type *peStack_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  Connector *local_40;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  *local_38;
  
  local_a8._M_str = startingInterface._M_str;
  local_a8._M_len = startingInterface._M_len;
  (__return_storage_ptr__->
  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = &(this->connections)._M_h;
  local_e0 = tagList;
  pVar18 = CLI::std::
           _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
           ::equal_range(local_38,&local_a8);
  _Var8._M_cur = (__node_type *)
                 pVar18.first.
                 super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                 ._M_cur;
  if (_Var8._M_cur != (__node_type *)0x0) {
    p_Stack_80 = (_Base_ptr)(local_98 + 8);
    local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
    local_88 = (_Base_ptr)0x0;
    local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78 = p_Stack_80;
    local_40 = this;
    std::
    _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::_M_insert_unique<std::basic_string_view<char,std::char_traits<char>>const&>
              ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)local_98,&local_a8);
    for (; (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
            )_Var8._M_cur !=
           pVar18.second.
           super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
           ._M_cur.
           super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
        ; _Var8._M_cur = (__node_type *)((_Var8._M_cur)->super__Hash_node_base)._M_nxt) {
      puVar12 = *(unsigned_long **)
                 ((long)&((_Var8._M_cur)->
                         super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                         ).
                         super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>
                         ._M_storage._M_storage + 0x38);
      puVar1 = *(unsigned_long **)
                ((long)&((_Var8._M_cur)->
                        super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>
                        ._M_storage._M_storage + 0x40);
      if (puVar12 == puVar1) {
LAB_00298515:
        std::vector<helics::apps::Connection,std::allocator<helics::apps::Connection>>::
        emplace_back<helics::apps::Connection_const&>
                  ((vector<helics::apps::Connection,std::allocator<helics::apps::Connection>> *)
                   __return_storage_ptr__,
                   (Connection *)
                   ((long)&((_Var8._M_cur)->
                           super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>
                           ._M_storage._M_storage + 0x10));
        pCVar9 = (__return_storage_ptr__->
                 super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        sVar3 = pCVar9[-1].interface1._M_len;
        if (sVar3 == local_a8._M_len) {
          if (sVar3 != 0) {
            iVar7 = bcmp(pCVar9[-1].interface1._M_str,local_a8._M_str,sVar3);
            if (iVar7 != 0) goto LAB_00298547;
          }
        }
        else {
LAB_00298547:
          local_c8._M_dataplus._M_p = (pointer)pCVar9[-1].interface1._M_len;
          local_c8._M_string_length = (size_type)pCVar9[-1].interface1._M_str;
          pcVar6 = pCVar9[-1].interface2._M_str;
          pCVar9[-1].interface1._M_len = pCVar9[-1].interface2._M_len;
          pCVar9[-1].interface1._M_str = pcVar6;
          pCVar9[-1].interface2._M_len = (size_t)local_c8._M_dataplus._M_p;
          pCVar9[-1].interface2._M_str = (char *)local_c8._M_string_length;
        }
      }
      else {
        puVar2 = (local_e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (puVar11 = (local_e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar2;
            puVar11 = puVar11 + 1) {
          puVar14 = puVar12;
          do {
            if (*puVar11 == *puVar14) {
              if (puVar11 != puVar2) goto LAB_00298515;
              goto LAB_00298565;
            }
            puVar14 = puVar14 + 1;
          } while (puVar14 != puVar1);
        }
      }
LAB_00298565:
    }
    pCVar9 = (__return_storage_ptr__->
             super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->
        super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>).
        _M_impl.super__Vector_impl_data._M_finish != pCVar9) {
      uVar17 = 0;
      do {
        iVar10 = CLI::std::
                 _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)local_98,&pCVar9[uVar17].interface2);
        if (iVar10._M_node == (_Base_ptr)(local_98 + 8)) {
          std::
          _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::_M_insert_unique<std::basic_string_view<char,std::char_traits<char>>const&>
                    ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)local_98,
                     &(__return_storage_ptr__->
                      super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar17].interface2);
          pVar18 = CLI::std::
                   _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                   ::equal_range(local_38,&(__return_storage_ptr__->
                                           super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                                           )._M_impl.super__Vector_impl_data._M_start[uVar17].
                                           interface2);
          _Var8._M_cur = (__node_type *)
                         pVar18.first.
                         super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                         ._M_cur;
          if ((_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
               )_Var8._M_cur !=
              pVar18.second.
              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
              ._M_cur.
              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
              && _Var8._M_cur != (__node_type *)0x0) {
            do {
              puVar12 = *(unsigned_long **)
                         ((long)&((_Var8._M_cur)->
                                 super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>
                                 ._M_storage._M_storage + 0x38);
              puVar1 = *(unsigned_long **)
                        ((long)&((_Var8._M_cur)->
                                super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>
                                ._M_storage._M_storage + 0x40);
              if (puVar12 == puVar1) {
LAB_00298638:
                std::vector<helics::apps::Connection,std::allocator<helics::apps::Connection>>::
                emplace_back<helics::apps::Connection_const&>
                          ((vector<helics::apps::Connection,std::allocator<helics::apps::Connection>>
                            *)__return_storage_ptr__,
                           (Connection *)
                           ((long)&((_Var8._M_cur)->
                                   super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>
                                   ._M_storage._M_storage + 0x10));
                pCVar9 = (__return_storage_ptr__->
                         super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                pCVar16 = (__return_storage_ptr__->
                          super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
                sVar3 = pCVar16[-1].interface1._M_len;
                if (sVar3 == pCVar9[uVar17].interface2._M_len) {
                  if (sVar3 != 0) {
                    iVar7 = bcmp(pCVar16[-1].interface1._M_str,pCVar9[uVar17].interface2._M_str,
                                 sVar3);
                    if (iVar7 != 0) goto LAB_0029866f;
                  }
                }
                else {
LAB_0029866f:
                  local_c8._M_dataplus._M_p = (pointer)pCVar16[-1].interface1._M_len;
                  local_c8._M_string_length = (size_type)pCVar16[-1].interface1._M_str;
                  pcVar6 = pCVar16[-1].interface2._M_str;
                  pCVar16[-1].interface1._M_len = pCVar16[-1].interface2._M_len;
                  pCVar16[-1].interface1._M_str = pcVar6;
                  pCVar16[-1].interface2._M_len = (size_t)local_c8._M_dataplus._M_p;
                  pCVar16[-1].interface2._M_str = (char *)local_c8._M_string_length;
                  pCVar16 = (__return_storage_ptr__->
                            super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                            )._M_impl.super__Vector_impl_data._M_finish;
                }
                iVar10 = CLI::std::
                         _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 *)local_98,&pCVar16[-1].interface2);
                if (iVar10._M_node != (_Base_ptr)(local_98 + 8)) {
                  __p = (__return_storage_ptr__->
                        super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                        )._M_impl.super__Vector_impl_data._M_finish + -1;
                  (__return_storage_ptr__->
                  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                  )._M_impl.super__Vector_impl_data._M_finish = __p;
                  CLI::std::allocator_traits<std::allocator<helics::apps::Connection>_>::
                  destroy<helics::apps::Connection>((allocator_type *)__return_storage_ptr__,__p);
                }
              }
              else {
                puVar2 = (local_e0->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                for (puVar11 = (local_e0->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start; puVar11 != puVar2;
                    puVar11 = puVar11 + 1) {
                  puVar14 = puVar12;
                  do {
                    if (*puVar11 == *puVar14) {
                      if (puVar11 != puVar2) goto LAB_00298638;
                      goto LAB_002986c3;
                    }
                    puVar14 = puVar14 + 1;
                  } while (puVar14 != puVar1);
                }
              }
LAB_002986c3:
              _Var8._M_cur = (__node_type *)((_Var8._M_cur)->super__Hash_node_base)._M_nxt;
            } while ((_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                      )_Var8._M_cur !=
                     pVar18.second.
                     super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                     ._M_cur.
                     super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                    );
          }
        }
        uVar17 = uVar17 + 1;
        pCVar9 = (__return_storage_ptr__->
                 super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar17 < (ulong)(((long)(__return_storage_ptr__->
                                       super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar9 >>
                                4) * -0x3333333333333333));
    }
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)local_98);
    this = local_40;
  }
  if (((__return_storage_ptr__->
       super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>).
       _M_impl.super__Vector_impl_data._M_start ==
       (__return_storage_ptr__->
       super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>).
       _M_impl.super__Vector_impl_data._M_finish) || (this->alwaysCheckRegex == true)) {
    psVar13 = (this->regexMatchers).
              super__Vector_base<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = (this->regexMatchers).
             super__Vector_base<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar13 != psVar4) {
      do {
        this_00 = (psVar13->
                  super___shared_ptr<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        puVar11 = (this_00->tags).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar2 = (this_00->tags).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (puVar11 == puVar2) {
LAB_00298790:
          testString._M_str = local_a8._M_str;
          testString._M_len = local_a8._M_len;
          RegexMatcher::generateMatch_abi_cxx11_(&local_c8,this_00,testString);
          if ((char *)local_c8._M_string_length != (char *)0x0) {
            local_88 = (_Base_ptr)0x0;
            p_Stack_80 = (_Base_ptr)0x0;
            local_98._0_8_ = 0;
            local_98._8_8_ = (char *)0x0;
            local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            peStack_58 = (element_type *)0x0;
            local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                      (&_Stack_d0,&local_d8,
                       (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_e1,&local_c8);
            this_01._M_pi = local_50._M_pi;
            local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_d0._M_pi;
            peStack_58 = local_d8;
            local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01._M_pi);
              if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
              }
            }
            peVar5 = (psVar13->
                     super___shared_ptr<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            local_98._0_8_ = (peVar5->interface1)._M_len;
            local_98._8_8_ = (peVar5->interface1)._M_str;
            CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                      (&local_70,
                       &((psVar13->
                         super___shared_ptr<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2>)
                        ._M_ptr)->tags);
            p_Stack_80 = (_Base_ptr)(peStack_58->_M_dataplus)._M_p;
            local_88 = (_Base_ptr)peStack_58->_M_string_length;
            local_78 = (_Base_ptr)CONCAT44(local_78._4_4_,1);
            CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
            emplace_back<helics::apps::Connection>(__return_storage_ptr__,(Connection *)local_98);
            if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_pi);
            }
            if (local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_70.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_70.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_70.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          puVar1 = (local_e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          for (puVar12 = (local_e0->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start; puVar12 != puVar1; puVar12 = puVar12 + 1)
          {
            puVar15 = puVar11;
            do {
              if (*puVar12 == *puVar15) {
                if (puVar12 != puVar1) goto LAB_00298790;
                goto LAB_002988ad;
              }
              puVar15 = puVar15 + 1;
            } while (puVar15 != puVar2);
          }
        }
LAB_002988ad:
        psVar13 = psVar13 + 1;
      } while (psVar13 != psVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Connection>
    Connector::buildPossibleConnectionList(std::string_view startingInterface,
                                           const std::vector<std::size_t>& tagList) const
{
    std::vector<Connection> matches;
    auto [first, last] = connections.equal_range(startingInterface);
    if (first != connections.end()) {
        std::set<std::string_view> searched;
        searched.insert(startingInterface);

        for (auto match = first; match != last; ++match) {
            if (match->second.tags.empty() ||
                std::find_first_of(tagList.begin(),
                                   tagList.end(),
                                   match->second.tags.begin(),
                                   match->second.tags.end()) != tagList.end()) {
                matches.emplace_back(match->second);
                if (matches.back().interface1 != startingInterface) {
                    std::swap(matches.back().interface1, matches.back().interface2);
                }
            }
        }
        std::size_t cascadeIndex{0};
        while (cascadeIndex < matches.size()) {
            if (searched.find(matches[cascadeIndex].interface2) != searched.end()) {
                ++cascadeIndex;
                continue;
            }
            searched.insert(matches[cascadeIndex].interface2);
            std::tie(first, last) = connections.equal_range(matches[cascadeIndex].interface2);
            if (first != connections.end()) {
                for (auto match = first; match != last; ++match) {
                    if (match->second.tags.empty() ||
                        std::find_first_of(tagList.begin(),
                                           tagList.end(),
                                           match->second.tags.begin(),
                                           match->second.tags.end()) != tagList.end()) {
                        matches.emplace_back(match->second);
                        if (matches.back().interface1 != matches[cascadeIndex].interface2) {
                            std::swap(matches.back().interface1, matches.back().interface2);
                        }
                        if (searched.find(matches.back().interface2) != searched.end()) {
                            // this would already be references and create a cyclic reference
                            matches.pop_back();
                        }
                    }
                }
            }
            ++cascadeIndex;
        }
    }
    if (matches.empty() || alwaysCheckRegex) {
        if (!regexMatchers.empty()) {
            for (const auto& rmatcher : regexMatchers) {
                if (rmatcher->tags.empty() ||
                    std::find_first_of(tagList.begin(),
                                       tagList.end(),
                                       rmatcher->tags.begin(),
                                       rmatcher->tags.end()) != tagList.end()) {
                    auto mstring = rmatcher->generateMatch(startingInterface);
                    if (!mstring.empty()) {
                        Connection connection;
                        connection.stringBuffer = std::make_shared<std::string>(mstring);
                        connection.interface1 = rmatcher->interface1;
                        connection.tags = rmatcher->tags;
                        connection.interface2 = *connection.stringBuffer;
                        connection.direction = InterfaceDirection::FROM_TO;
                        matches.push_back(std::move(connection));
                    }
                }
            }
        }
    }
    return matches;
}